

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O0

int g80_physpages_from_pt(uint64_t pt,int hostmem,uint64_t *phys_pages)

{
  uint uVar1;
  int local_34;
  int entries;
  uint32_t tmp;
  int i;
  uint32_t hi;
  uint32_t lo;
  uint64_t *phys_pages_local;
  int hostmem_local;
  uint64_t pt_local;
  
  local_34 = 0;
  tmp = (uint)(pt >> 0x10) & 0xffffff;
  if (hostmem != 0) {
    tmp = tmp | 0x2000000;
  }
  i = (uint)pt & 0xffff;
  poke(0x1700,tmp);
  for (entries = 0; entries < 0x400; entries = entries + 1) {
    uVar1 = peek(i + 0x700000);
    if (((uVar1 & 0xff) == 0x31) && ((uVar1 & 0xfffff000) != 0)) {
      phys_pages[local_34] = (ulong)uVar1 & 0xfffff000;
      local_34 = local_34 + 1;
    }
    i = i + 8;
  }
  return local_34;
}

Assistant:

int g80_physpages_from_pt(uint64_t pt, int hostmem, uint64_t *phys_pages)
{
	uint32_t lo, hi;
	int i;
	uint32_t tmp;
	int entries = 0;

	hi = (pt & 0xffffff0000ull) >> 16;
	if (hostmem)
		hi |= 0x2000000;

	lo = (pt & 0xffff);

	// Lets go and read this pt
	poke(0x1700, hi);
	for (i = 0; i < 1024; i++, lo += 8) {
		tmp = peek(0x700000 + lo);
		if ((tmp & 0x000000ff) != 0x31) {
			continue;
		}
		if (tmp & 0xfffff000)
			phys_pages[entries++] = tmp & 0xfffff000ull;

	}

	return entries;
}